

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_or_many_heap(uint32_t number,roaring_bitmap_t **x)

{
  byte type1;
  ushort key;
  uint uVar1;
  roaring_pq_element_t *prVar2;
  container_t *c1;
  container_t *c2;
  _Bool _Var3;
  undefined7 uVar4;
  roaring_bitmap_t *ra;
  roaring_bitmap_t *prVar5;
  roaring_pq_t *pq;
  size_t sVar6;
  uint64_t uVar7;
  roaring_array_t *ra_00;
  shared_container_t *psVar8;
  ushort *puVar9;
  uint end_index;
  roaring_pq_element_t *prVar10;
  void **ppvVar11;
  ushort uVar12;
  uint32_t i_00;
  uint8_t uVar13;
  ulong uVar14;
  roaring_array_t *prVar15;
  roaring_pq_element_t *t;
  uint16_t key_00;
  long lVar16;
  uint32_t i;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  roaring_pq_element_t newelement;
  roaring_pq_element_t x1;
  roaring_pq_element_t x2;
  uint local_b8;
  container_t *local_b0;
  roaring_pq_element_t local_90;
  container_t *local_78;
  uint local_6c;
  roaring_pq_element_t local_68;
  roaring_pq_element_t local_48;
  uint start_index;
  
  if (number == 1) {
    prVar5 = roaring_bitmap_copy(*x);
    return prVar5;
  }
  if (number == 0) {
    prVar5 = roaring_bitmap_create_with_capacity(0);
    return prVar5;
  }
  uVar14 = (ulong)number;
  pq = (roaring_pq_t *)roaring_malloc(uVar14 * 0x18 + 0x10);
  prVar10 = (roaring_pq_element_t *)(pq + 1);
  pq->elements = prVar10;
  pq->size = uVar14;
  lVar16 = 0;
  uVar17 = 0;
  do {
    prVar5 = x[uVar17];
    *(roaring_bitmap_t **)((long)&prVar10->bitmap + lVar16) = prVar5;
    (&prVar10->is_temporary)[lVar16] = false;
    sVar6 = roaring_bitmap_portable_size_in_bytes(prVar5);
    prVar10 = pq->elements;
    *(size_t *)((long)&prVar10->size + lVar16) = sVar6;
    uVar17 = uVar17 + 1;
    lVar16 = lVar16 + 0x18;
  } while (uVar14 != uVar17);
  i_00 = number >> 1;
  do {
    percolate_down(pq,i_00);
    bVar19 = i_00 != 0;
    i_00 = i_00 - 1;
  } while (bVar19);
  uVar17 = pq->size;
joined_r0x0011051c:
  if (uVar17 < 2) {
    prVar5 = pq->elements->bitmap;
    pq->size = uVar17 - 1;
    roaring_bitmap_repair_after_lazy(prVar5);
    roaring_free(pq);
    return prVar5;
  }
  prVar2 = pq->elements;
  local_68.bitmap = prVar2->bitmap;
  local_68.size = prVar2->size;
  local_68.is_temporary = prVar2->is_temporary;
  local_68._9_7_ = *(undefined7 *)&prVar2->field_0x9;
  t = &local_68;
  uVar7 = uVar17 - 1;
  pq->size = uVar7;
  prVar2->bitmap = prVar2[uVar7].bitmap;
  prVar10 = prVar2 + uVar7;
  _Var3 = prVar10->is_temporary;
  uVar4 = *(undefined7 *)&prVar10->field_0x9;
  prVar2->size = prVar10->size;
  prVar2->is_temporary = _Var3;
  *(undefined7 *)&prVar2->field_0x9 = uVar4;
  percolate_down(pq,0);
  prVar10 = pq->elements;
  local_48.bitmap = prVar10->bitmap;
  local_48.size = prVar10->size;
  local_48.is_temporary = prVar10->is_temporary;
  local_48._9_7_ = *(undefined7 *)&prVar10->field_0x9;
  uVar17 = pq->size;
  uVar7 = uVar17 - 1;
  pq->size = uVar7;
  if (1 < uVar17) {
    prVar10->bitmap = prVar10[uVar7].bitmap;
    prVar2 = prVar10 + uVar7;
    _Var3 = prVar2->is_temporary;
    uVar4 = *(undefined7 *)&prVar2->field_0x9;
    prVar10->size = prVar2->size;
    prVar10->is_temporary = _Var3;
    *(undefined7 *)&prVar10->field_0x9 = uVar4;
    percolate_down(pq,0);
  }
  ra = local_48.bitmap;
  prVar5 = local_68.bitmap;
  if (local_68.is_temporary != true) {
    if (local_48.is_temporary != false) {
      roaring_bitmap_lazy_or_inplace(local_48.bitmap,local_68.bitmap,false);
      local_48.size = roaring_bitmap_portable_size_in_bytes(ra);
      t = &local_48;
      goto LAB_001109b2;
    }
    ra_00 = &roaring_bitmap_lazy_or(local_68.bitmap,local_48.bitmap,false)->high_low_container;
    local_90.size = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)ra_00);
    local_90.is_temporary = true;
    goto LAB_001109a7;
  }
  if (local_48.is_temporary != false) {
    local_90.size = local_90.size & 0xffffffffffffff00;
    uVar1 = *(uint *)&(local_68.bitmap)->high_low_container;
    if (uVar1 == 0) {
      roaring_bitmap_free(local_68.bitmap);
      ra_00 = &ra->high_low_container;
    }
    else {
      end_index = *(uint *)&(local_48.bitmap)->high_low_container;
      if (end_index != 0) {
        uVar18 = end_index;
        if ((int)uVar1 < (int)end_index) {
          uVar18 = uVar1;
        }
        ra_00 = &roaring_bitmap_create_with_capacity(uVar18)->high_low_container;
        puVar9 = *(uint16_t **)((long)prVar5 + 0x10);
        key_00 = **(uint16_t **)((long)ra + 0x10);
        local_b8 = 0;
        uVar18 = 0;
LAB_0011061e:
        do {
          key = *puVar9;
          start_index = uVar18;
          while( true ) {
            uVar18 = start_index + 1;
            prVar15 = &ra->high_low_container;
            if (key == key_00) break;
            if (key < key_00) {
              ra_append(ra_00,key,(*(void ***)((long)prVar5 + 8))[local_b8 & 0xffff],
                        (*(uint8_t **)((long)prVar5 + 0x18))[local_b8 & 0xffff]);
              local_b8 = local_b8 + 1;
              if (local_b8 == uVar1) goto LAB_00110967;
              puVar9 = (ushort *)
                       ((ulong)((local_b8 & 0xffff) * 2) + (long)*(uint16_t **)((long)prVar5 + 0x10)
                       );
              uVar18 = start_index;
              goto LAB_0011061e;
            }
            ra_append(ra_00,key_00,(*(void ***)((long)ra + 8))[(ulong)start_index & 0xffff],
                      (*(uint8_t **)((long)ra + 0x18))[(ulong)start_index & 0xffff]);
            start_index = end_index;
            if (end_index == uVar18) goto LAB_0011092d;
            key_00 = (*(uint16_t **)((long)ra + 0x10))[uVar18 & 0xffff];
            start_index = uVar18;
          }
          ppvVar11 = *(void ***)((long)prVar5 + 8);
          uVar17 = (ulong)(ushort)local_b8;
          psVar8 = (shared_container_t *)ppvVar11[uVar17];
          if ((*(uint8_t **)((long)prVar5 + 0x18))[uVar17] == '\x04') {
            psVar8 = (shared_container_t *)
                     shared_container_extract_copy
                               (psVar8,*(uint8_t **)((long)prVar5 + 0x18) + uVar17);
            ppvVar11 = *(void ***)((long)prVar5 + 8);
          }
          uVar14 = (ulong)((local_b8 & 0xffff) * 8);
          *(shared_container_t **)((long)ppvVar11 + uVar14) = psVar8;
          type1 = (*(uint8_t **)((long)prVar5 + 0x18))[uVar17];
          c1 = *(container_t **)((long)*(void ***)((long)prVar5 + 8) + uVar14);
          ppvVar11 = *(void ***)((long)ra + 8);
          uVar12 = (ushort)start_index;
          psVar8 = (shared_container_t *)ppvVar11[uVar12];
          if ((*(uint8_t **)((long)ra + 0x18))[uVar12] == '\x04') {
            psVar8 = (shared_container_t *)
                     shared_container_extract_copy(psVar8,*(uint8_t **)((long)ra + 0x18) + uVar12);
            ppvVar11 = *(void ***)((long)ra + 8);
          }
          uVar17 = (ulong)((start_index & 0xffff) * 8);
          *(shared_container_t **)((long)ppvVar11 + uVar17) = psVar8;
          uVar13 = (*(uint8_t **)((long)ra + 0x18))[uVar12];
          c2 = *(container_t **)((long)*(void ***)((long)ra + 8) + uVar17);
          if ((uVar13 == '\x01') && (type1 != 1)) {
            local_78 = c2;
            local_b0 = container_lazy_ior(c2,'\x01',c1,type1,(uint8_t *)&local_90);
            container_free(c1,type1);
            if (local_b0 != local_78) {
              uVar13 = '\x01';
LAB_0011081f:
              container_free(local_78,uVar13);
            }
          }
          else {
            local_6c = (uint)type1;
            local_78 = c1;
            local_b0 = container_lazy_ior(c1,type1,c2,uVar13,(uint8_t *)&local_90);
            container_free(c2,uVar13);
            if (local_b0 != local_78) {
              uVar13 = (uint8_t)local_6c;
              goto LAB_0011081f;
            }
          }
          ra_append(ra_00,key,local_b0,(uint8_t)local_90.size);
          local_b8 = local_b8 + 1;
          start_index = uVar18;
          if ((local_b8 == uVar1) || (end_index == uVar18)) goto LAB_0011092d;
          puVar9 = (ushort *)
                   ((ulong)((local_b8 & 0xffff) * 2) + (long)*(uint16_t **)((long)prVar5 + 0x10));
          key_00 = (*(uint16_t **)((long)ra + 0x10))[uVar18 & 0xffff];
        } while( true );
      }
      roaring_bitmap_free(local_48.bitmap);
      ra_00 = &prVar5->high_low_container;
    }
    goto LAB_0011098c;
  }
  roaring_bitmap_lazy_or_inplace(local_68.bitmap,local_48.bitmap,false);
  local_68.size = roaring_bitmap_portable_size_in_bytes(prVar5);
  goto LAB_001109b2;
LAB_0011092d:
  if ((local_b8 == uVar1) ||
     (bVar19 = start_index == end_index, prVar15 = &prVar5->high_low_container, end_index = uVar1,
     start_index = local_b8, bVar19)) {
LAB_00110967:
    ra_append_move_range(ra_00,prVar15,start_index,end_index);
  }
  ra_clear_without_containers(&prVar5->high_low_container);
  ra_clear_without_containers(&ra->high_low_container);
  roaring_free(prVar5);
  roaring_free(ra);
LAB_0011098c:
  local_90.size = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)ra_00);
  local_90.is_temporary = &ra->high_low_container != ra_00 || &prVar5->high_low_container != ra_00;
LAB_001109a7:
  t = &local_90;
  local_90.bitmap = (roaring_bitmap_t *)ra_00;
LAB_001109b2:
  pq_add(pq,t);
  uVar17 = pq->size;
  goto joined_r0x0011051c;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many_heap(uint32_t number,
                                              const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_pq_t *pq = create_pq(x, number);
    while (pq->size > 1) {
        roaring_pq_element_t x1 = pq_poll(pq);
        roaring_pq_element_t x2 = pq_poll(pq);

        if (x1.is_temporary && x2.is_temporary) {
            roaring_bitmap_t *newb =
                lazy_or_from_lazy_inputs(x1.bitmap, x2.bitmap);
            // should normally return a fresh new bitmap *except* that
            // it can return x1.bitmap or x2.bitmap in degenerate cases
            bool temporary = !((newb == x1.bitmap) && (newb == x2.bitmap));
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = temporary, .bitmap = newb};
            pq_add(pq, &newelement);
        } else if (x2.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x2.bitmap, x1.bitmap, false);
            x2.size = roaring_bitmap_portable_size_in_bytes(x2.bitmap);
            pq_add(pq, &x2);
        } else if (x1.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x1.bitmap, x2.bitmap, false);
            x1.size = roaring_bitmap_portable_size_in_bytes(x1.bitmap);

            pq_add(pq, &x1);
        } else {
            roaring_bitmap_t *newb =
                roaring_bitmap_lazy_or(x1.bitmap, x2.bitmap, false);
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = true, .bitmap = newb};

            pq_add(pq, &newelement);
        }
    }
    roaring_pq_element_t X = pq_poll(pq);
    roaring_bitmap_t *answer = X.bitmap;
    roaring_bitmap_repair_after_lazy(answer);
    pq_free(pq);
    return answer;
}